

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_listener_close(void *arg)

{
  nni_aio *aio_00;
  int local_24;
  int i;
  sfd_listener *l;
  nni_aio *aio;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
  *(undefined1 *)((long)arg + 0x94) = 1;
  while( true ) {
    aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x98));
    if (aio_00 == (nni_aio *)0x0) break;
    nni_aio_list_remove(aio_00);
    nni_aio_finish_error(aio_00,NNG_ECLOSED);
  }
  for (local_24 = 0; local_24 < *(int *)((long)arg + 0x50); local_24 = local_24 + 1) {
    nni_sfd_close_fd(*(int *)((long)arg + (long)local_24 * 4 + 0x54));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  return;
}

Assistant:

static void
sfd_listener_close(void *arg)
{
	nni_aio      *aio;
	sfd_listener *l = arg;
	nni_mtx_lock(&l->mtx);
	l->closed = true;
	while ((aio = nni_list_first(&l->accept_q)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	for (int i = 0; i < l->listen_cnt; i++) {
		nni_sfd_close_fd(l->listen_q[i]);
	}
	nni_mtx_unlock(&l->mtx);
}